

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

config_value * config_value_create_string(char *string)

{
  config_value *pcVar1;
  
  pcVar1 = (config_value *)malloc(0x10);
  if (pcVar1 != (config_value *)0x0) {
    pcVar1->type = STRING;
    (pcVar1->data).string = string;
  }
  return pcVar1;
}

Assistant:

struct config_value *config_value_create_string(char *string)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = STRING;
        value->data.string = string;

        return value;
}